

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIf.c
# Opt level: O0

int Abc_ObjCompareFlow(Abc_Obj_t **ppNode0,Abc_Obj_t **ppNode1)

{
  float fVar1;
  float fVar2;
  float Flow1;
  float Flow0;
  Abc_Obj_t **ppNode1_local;
  Abc_Obj_t **ppNode0_local;
  
  fVar1 = Abc_Int2Float(((*ppNode0)->field_6).iTemp);
  fVar2 = Abc_Int2Float(((*ppNode1)->field_6).iTemp);
  if (fVar1 <= fVar2) {
    if (fVar2 <= fVar1) {
      ppNode0_local._4_4_ = 0;
    }
    else {
      ppNode0_local._4_4_ = 1;
    }
  }
  else {
    ppNode0_local._4_4_ = -1;
  }
  return ppNode0_local._4_4_;
}

Assistant:

int Abc_ObjCompareFlow( Abc_Obj_t ** ppNode0, Abc_Obj_t ** ppNode1 )
{
    float Flow0 = Abc_Int2Float((int)(ABC_PTRINT_T)(*ppNode0)->pCopy);
    float Flow1 = Abc_Int2Float((int)(ABC_PTRINT_T)(*ppNode1)->pCopy);
    if ( Flow0 > Flow1 )
        return -1;
    if ( Flow0 < Flow1 )
        return 1;
    return 0;
}